

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# radix_sort.cpp
# Opt level: O1

vector<unsigned_char,_std::allocator<unsigned_char>_> * __thiscall
shuffle_fn::operator()
          (vector<unsigned_char,_std::allocator<unsigned_char>_> *__return_storage_ptr__,
          shuffle_fn *this,vector<unsigned_char,_std::allocator<unsigned_char>_> *c)

{
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  __first;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  __last;
  uint uVar1;
  ulong uVar2;
  size_t __i;
  long lVar3;
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  local_13a8;
  
  __first._M_current =
       (c->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
       super__Vector_impl_data._M_start;
  __last._M_current =
       (c->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  uVar1 = std::random_device::_M_getval();
  local_13a8._M_x[0] = (unsigned_long)uVar1;
  lVar3 = 1;
  uVar2 = local_13a8._M_x[0];
  do {
    uVar2 = (ulong)(((uint)(uVar2 >> 0x1e) ^ (uint)uVar2) * 0x6c078965 + (int)lVar3);
    local_13a8._M_x[lVar3] = uVar2;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 0x270);
  local_13a8._M_p = 0x270;
  std::
  shuffle<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
            (__first,__last,&local_13a8);
  (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
  _M_impl.super__Vector_impl_data._M_start =
       (c->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
       super__Vector_impl_data._M_start;
  (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
  _M_impl.super__Vector_impl_data._M_finish =
       (c->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  (__return_storage_ptr__->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       (c->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (c->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (c->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (c->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return __return_storage_ptr__;
}

Assistant:

auto operator () (Container c)
    {
        std::shuffle(c.begin(), c.end(), std::mt19937((*rd)()));
        return c;
    }